

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

trap_kind_conflict * lookup_trap(char *desc)

{
  int iVar1;
  trap_kind_conflict *ptVar2;
  char *pcVar3;
  trap_kind_conflict *kind;
  trap_kind_conflict *closest;
  wchar_t i;
  char *desc_local;
  
  kind = (trap_kind_conflict *)0x0;
  closest._4_4_ = 1;
  do {
    if ((int)(uint)z_info->trap_max <= closest._4_4_) {
      return kind;
    }
    ptVar2 = trap_info + closest._4_4_;
    if (ptVar2->name != (char *)0x0) {
      iVar1 = strcmp(desc,ptVar2->desc);
      if (iVar1 == 0) {
        return ptVar2;
      }
      if ((kind == (trap_kind_conflict *)0x0) &&
         (pcVar3 = my_stristr(ptVar2->desc,desc), pcVar3 != (char *)0x0)) {
        kind = ptVar2;
      }
    }
    closest._4_4_ = closest._4_4_ + 1;
  } while( true );
}

Assistant:

struct trap_kind *lookup_trap(const char *desc)
{
	int i;
	struct trap_kind *closest = NULL;

	/* Look for it */
	for (i = 1; i < z_info->trap_max; i++) {
		struct trap_kind *kind = &trap_info[i];
		if (!kind->name)
			continue;

		/* Test for equality */
		if (streq(desc, kind->desc))
			return kind;

		/* Test for close matches */
		if (!closest && my_stristr(kind->desc, desc))
			closest = kind;
	}

	/* Return our best match */
	return closest;
}